

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnLocalDecl(SharedValidator *this,Location *loc,Index count,Type type)

{
  pointer *ppLVar1;
  iterator __position;
  undefined4 in_register_0000000c;
  uint uVar2;
  LocalDecl local_8;
  
  __position._M_current =
       (this->locals_).
       super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
    uVar2 = 0;
  }
  else {
    uVar2 = __position._M_current[-1].end;
    if (CARRY4(uVar2,count)) {
      PrintError(this,loc,"local count must be < 0x10000000",
                 CONCAT44(in_register_0000000c,type.enum_),(ulong)uVar2,(ulong)(uVar2 + count));
      return (Result)Error;
    }
  }
  local_8.end = uVar2 + count;
  local_8.type.enum_ = type.enum_;
  if (__position._M_current ==
      (this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
    ::_M_realloc_insert<wabt::SharedValidator::LocalDecl>(&this->locals_,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    ppLVar1 = &(this->locals_).
               super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
  return (Result)Ok;
}

Assistant:

Result SharedValidator::OnLocalDecl(const Location& loc,
                                    Index count,
                                    Type type) {
  const auto max_locals = std::numeric_limits<Index>::max();
  if (count > max_locals - GetLocalCount()) {
    PrintError(loc, "local count must be < 0x10000000");
    return Result::Error;
  }
  locals_.push_back(LocalDecl{type, GetLocalCount() + count});
  return Result::Ok;
}